

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v7::detail::bigint::assign(bigint *this,uint64_t n)

{
  uint *puVar1;
  ulong in_RSI;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *in_RDI;
  size_t num_bigits;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar2;
  unsigned_long local_18;
  ulong local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  do {
    uVar2 = (uint)local_10;
    puVar1 = buffer<unsigned_int>::operator[]<unsigned_long>
                       (&in_RDI->super_buffer<unsigned_int>,local_18);
    *puVar1 = uVar2;
    local_10 = local_10 >> 0x20;
    local_18 = local_18 + 1;
  } while (local_10 != 0);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
            (in_RDI,CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  *(undefined4 *)&in_RDI[1].super_buffer<unsigned_int>._vptr_buffer = 0;
  return;
}

Assistant:

void assign(uint64_t n) {
    size_t num_bigits = 0;
    do {
      bigits_[num_bigits++] = n & ~bigit(0);
      n >>= bigit_bits;
    } while (n != 0);
    bigits_.resize(num_bigits);
    exp_ = 0;
  }